

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::move_from(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *this,flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *other)

{
  pointer_type pcVar1;
  buffer_type *pbVar2;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *other_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  clear(this);
  pbVar2 = buff(other);
  pcVar1 = pbVar2->begin;
  pbVar2 = buff(this);
  pbVar2->begin = pcVar1;
  pbVar2 = buff(other);
  pcVar1 = pbVar2->end;
  pbVar2 = buff(this);
  pbVar2->end = pcVar1;
  pbVar2 = buff(other);
  pcVar1 = pbVar2->last;
  pbVar2 = buff(this);
  pbVar2->last = pcVar1;
  pbVar2 = buff(other);
  pbVar2->begin = (pointer_type)0x0;
  pbVar2 = buff(other);
  pbVar2->end = (pointer_type)0x0;
  pbVar2 = buff(other);
  pbVar2->last = (pointer_type)0x0;
  return;
}

Assistant:

void move_from(flat_forward_list &&other) noexcept {
        clear();
        buff().begin = other.buff().begin;
        buff().end = other.buff().end;
        buff().last = other.buff().last;
        other.buff().begin = nullptr;
        other.buff().end = nullptr;
        other.buff().last = nullptr;
    }